

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

string * __thiscall
deqp::gls::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,gls *this,ShaderCaseSpecification *spec)

{
  bool bVar1;
  bool bVar2;
  DataType DVar3;
  DataType dataType;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  Value *pVVar7;
  const_reference this_00;
  char *pcVar8;
  char *refTypeStr;
  char *floatTypeStr;
  DataType floatType;
  DataType basicType;
  Value *val;
  size_t ndx;
  char *prec;
  char *fragIn;
  bool customColorOut;
  ostringstream local_190 [7];
  bool usesInout;
  ostringstream shader;
  ShaderCaseSpecification *spec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = glu::glslVersionUsesInOutQualifiers(*(GLSLVersion *)(this + 8));
  pcVar4 = "varying";
  if (bVar1) {
    pcVar4 = "in";
  }
  bVar2 = supportsFragmentHighp(*(GLSLVersion *)(this + 8));
  pcVar8 = "_mediump";
  if (bVar2) {
    pcVar8 = "_highp";
  }
  pcVar5 = glu::getGLSLVersionDeclaration(*(GLSLVersion *)(this + 8));
  poVar6 = std::operator<<((ostream *)local_190,pcVar5);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)local_190,"precision ");
  poVar6 = std::operator<<(poVar6,pcVar8 + 1);
  std::operator<<(poVar6," float;\n");
  poVar6 = std::operator<<((ostream *)local_190,"precision ");
  poVar6 = std::operator<<(poVar6,pcVar8 + 1);
  std::operator<<(poVar6," int;\n");
  std::operator<<((ostream *)local_190,"\n");
  if (bVar1) {
    std::operator<<((ostream *)local_190,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    std::operator<<((ostream *)local_190,"\n");
  }
  glu::sl::genCompareFunctions((ostringstream *)local_190,(ValueBlock *)(this + 0x30),true);
  std::operator<<((ostream *)local_190,"\n");
  val = (Value *)0x0;
  while( true ) {
    pVVar7 = (Value *)std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size
                                ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)
                                 (this + 0x48));
    if (pVVar7 <= val) break;
    this_00 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[]
                        ((vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *)(this + 0x48),
                         (size_type)val);
    DVar3 = glu::VarType::getBasicType(&this_00->type);
    dataType = glu::getDataTypeFloatScalars(DVar3);
    pcVar8 = glu::getDataTypeName(dataType);
    pcVar5 = glu::getDataTypeName(DVar3);
    DVar3 = glu::getDataTypeScalarType(DVar3);
    if (DVar3 == TYPE_FLOAT) {
      poVar6 = std::operator<<((ostream *)local_190,pcVar4);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,pcVar8);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,(string *)&this_00->name);
      std::operator<<(poVar6,";\n");
    }
    else {
      poVar6 = std::operator<<((ostream *)local_190,pcVar4);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = std::operator<<(poVar6,pcVar8);
      poVar6 = std::operator<<(poVar6," v_");
      poVar6 = std::operator<<(poVar6,(string *)&this_00->name);
      std::operator<<(poVar6,";\n");
    }
    poVar6 = std::operator<<((ostream *)local_190,"uniform ");
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::operator<<(poVar6," ref_");
    poVar6 = std::operator<<(poVar6,(string *)&this_00->name);
    std::operator<<(poVar6,";\n");
    val = (Value *)((long)&(val->type).m_type + 1);
  }
  std::operator<<((ostream *)local_190,"\n");
  std::operator<<((ostream *)local_190,"void main()\n");
  std::operator<<((ostream *)local_190,"{\n");
  std::operator<<((ostream *)local_190,"\t");
  pcVar4 = "gl_FragColor";
  if (bVar1) {
    pcVar4 = "dEQP_FragColor";
  }
  genCompareOp((ostringstream *)local_190,pcVar4,(ValueBlock *)(this + 0x30),"v_",(char *)0x0);
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static string genFragmentShader (const ShaderCaseSpecification& spec)
{
	ostringstream		shader;
	const bool			usesInout		= glslVersionUsesInOutQualifiers(spec.targetVersion);
	const bool			customColorOut	= usesInout;
	const char*	const	fragIn			= usesInout ? "in" : "varying";
	const char*	const	prec			= supportsFragmentHighp(spec.targetVersion) ? "highp" : "mediump";

	shader << glu::getGLSLVersionDeclaration(spec.targetVersion) << "\n";

	shader << "precision " << prec << " float;\n";
	shader << "precision " << prec << " int;\n";
	shader << "\n";

	if (customColorOut)
	{
		shader << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		shader << "\n";
	}

	genCompareFunctions(shader, spec.values, true);
	shader << "\n";

	// Declarations (varying, reference for each output).
	for (size_t ndx = 0; ndx < spec.values.outputs.size(); ndx++)
	{
		const Value&		val				= spec.values.outputs[ndx];
		const DataType		basicType		= val.type.getBasicType();
		const DataType		floatType		= getDataTypeFloatScalars(basicType);
		const char* const	floatTypeStr	= getDataTypeName(floatType);
		const char* const	refTypeStr		= getDataTypeName(basicType);

		if (getDataTypeScalarType(basicType) == TYPE_FLOAT)
			shader << fragIn << " " << floatTypeStr << " " << val.name << ";\n";
		else
			shader << fragIn << " " << floatTypeStr << " v_" << val.name << ";\n";

		shader << "uniform " << refTypeStr << " ref_" << val.name << ";\n";
	}

	shader << "\n";
	shader << "void main()\n";
	shader << "{\n";

	shader << "	";
	genCompareOp(shader, customColorOut ? "dEQP_FragColor" : "gl_FragColor", spec.values, "v_", DE_NULL);

	shader << "}\n";
	return shader.str();
}